

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

int __thiscall
TPZCompElHCurl<pzshape::TPZShapeQuad>::NSideConnects
          (TPZCompElHCurl<pzshape::TPZShapeQuad> *this,int side)

{
  int iVar1;
  int **ppiVar2;
  int *piVar3;
  int *subSide;
  int *__end1;
  int *__begin1;
  TPZStack<int,_10> *__range1;
  TPZStack<int,_10> sideClosure;
  int nCons;
  int in_stack_ffffffffffffff5c;
  TPZStack<int,_10> *in_stack_ffffffffffffff60;
  TPZStack<int,_10> *in_stack_ffffffffffffff68;
  TPZStack<int,_10> *this_00;
  int *local_78;
  TPZStack<int,_10> local_58;
  int local_10;
  
  local_10 = 0;
  this_00 = &local_58;
  TPZStack<int,_10>::TPZStack(this_00);
  pztopology::TPZQuadrilateral::LowerDimensionSides
            ((int)((ulong)this_00 >> 0x20),in_stack_ffffffffffffff68);
  TPZStack<int,_10>::Push(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  ppiVar2 = TPZVec<int>::begin((TPZVec<int> *)&local_58);
  local_78 = *ppiVar2;
  piVar3 = TPZVec<int>::end((TPZVec<int> *)&local_58);
  for (; iVar1 = local_10, local_78 != piVar3; local_78 = local_78 + 1) {
    iVar1 = pztopology::TPZQuadrilateral::SideDimension(0x1bd9e0b);
    if (iVar1 != 0) {
      local_10 = local_10 + 1;
    }
  }
  TPZStack<int,_10>::~TPZStack((TPZStack<int,_10> *)0x1bd9e6d);
  return iVar1;
}

Assistant:

int TPZCompElHCurl<TSHAPE>::NSideConnects(int side) const{
#ifdef PZDEBUG
    if(side <0 || side >= TSHAPE::NSides){
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__ << "Side: " << side <<"unhandled case\n";
        PZError<<sout.str();
#ifdef PZ_LOG
        LOGPZ_ERROR(logger,sout.str())
#endif
    }
#endif
    int nCons = 0;
    TPZStack<int> sideClosure;
    TSHAPE::LowerDimensionSides(side,sideClosure);
    sideClosure.Push(side);
    for(auto &subSide :sideClosure){
        if(TSHAPE::SideDimension(subSide)) nCons++;
    }
    return nCons;
}